

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramPipelineStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ActiveProgramCase::iterate(ActiveProgramCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  GLenum GVar5;
  RenderContext *pRVar6;
  ProgramSources *pPVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  TestError *this_00;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  ScopedLogSection local_5e8;
  ScopedLogSection section_3;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  ScopedLogSection local_590;
  ScopedLogSection section_2;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  ScopedLogSection local_510;
  ScopedLogSection section_1;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  ScopedLogSection local_4b8;
  ScopedLogSection section;
  string local_4a8;
  undefined1 local_488 [8];
  ResultCollector result;
  CallLogWrapper gl;
  ProgramPipeline pipeline;
  string local_408;
  ShaderSource local_3e8;
  ProgramSeparable local_3b9;
  ProgramSources local_3b8;
  undefined1 local_2e8 [8];
  ShaderProgram frgProgram;
  string local_210;
  ShaderSource local_1f0;
  ProgramSeparable local_1b1;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram vtxProgram;
  ActiveProgramCase *this_local;
  
  vtxProgram.m_program.m_info.linkTimeUs = (deUint64)this;
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_1b0);
  glu::ProgramSeparable::ProgramSeparable(&local_1b1,true);
  pPVar7 = glu::ProgramSources::operator<<(&local_1b0,&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,
             "#version 310 es\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)((long)&frgProgram.m_program.m_info.linkTimeUs + 7));
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_1f0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,pRVar6,pPVar7);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&frgProgram.m_program.m_info.linkTimeUs + 7));
  glu::ProgramSources::~ProgramSources(&local_1b0);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_3b8);
  glu::ProgramSeparable::ProgramSeparable(&local_3b9,true);
  pPVar7 = glu::ProgramSources::operator<<(&local_3b8,&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,
             "#version 310 es\nin highp vec4 v_color;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,(allocator<char> *)&pipeline.field_0xf);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3e8,&local_408);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_3e8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2e8,pRVar6,pPVar7);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&pipeline.field_0xf);
  glu::ProgramSources::~ProgramSources(&local_3b8);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramPipeline::ProgramPipeline((ProgramPipeline *)&gl.m_enableLog,pRVar6);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar2),pTVar8);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8," // ERROR: ",(allocator<char> *)((long)&section.m_log + 7));
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_488,pTVar8,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"VtxProg",&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"Vertex program",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_4b8,pTVar8,&local_4d8,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar8,(ShaderProgram *)local_e0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_4b8);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"FrgProg",&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"Fragment program",&local_559);
  tcu::ScopedLogSection::ScopedLogSection(&local_510,pTVar8,&local_530,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar8,(ShaderProgram *)local_2e8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_510);
  bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if ((bVar1) && (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_2e8), bVar1)) {
    glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true)
    ;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&gl.m_enableLog);
    glu::CallLogWrapper::glBindProgramPipeline
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar3);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&gl.m_enableLog);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar3,1,dVar4);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&gl.m_enableLog);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e8);
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar3,2,dVar4);
    GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar5,"gen pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x7d);
    glu::CallLogWrapper::glBindProgramPipeline
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0);
    GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar5,"unbind pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x7f);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"Initial",&local_5b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d8,"Initial",(allocator<char> *)((long)&section_3.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_590,pTVar8,&local_5b0,&local_5d8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_3.m_log + 7));
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&gl.m_enableLog);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              ((ResultCollector *)local_488,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               dVar3,0x8259,0,this->m_verifier);
    tcu::ScopedLogSection::~ScopedLogSection(&local_590);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"Set",&local_609);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"Set",&local_631);
    tcu::ScopedLogSection::ScopedLogSection(&local_5e8,pTVar8,&local_608,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&gl.m_enableLog);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e8);
    glu::CallLogWrapper::glActiveShaderProgram
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar3,dVar4);
    GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar5,"gen pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x8a);
    dVar3 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&gl.m_enableLog);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e8);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              ((ResultCollector *)local_488,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               dVar3,0x8259,dVar4,this->m_verifier);
    tcu::ScopedLogSection::~ScopedLogSection(&local_5e8);
    tcu::ResultCollector::setTestContextResult
              ((ResultCollector *)local_488,
               (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::ResultCollector::~ResultCollector((ResultCollector *)local_488);
    glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)&gl.m_enableLog);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2e8);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
    return STOP;
  }
  section_2.m_log._6_1_ = 1;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"failed to build program",
             (allocator<char> *)((long)&section_2.m_log + 7));
  tcu::TestError::TestError(this_00,&local_580);
  section_2.m_log._6_1_ = 0;
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ActiveProgramCase::IterateResult ActiveProgramCase::iterate (void)
{
	const glu::ShaderProgram	vtxProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::VertexSource(s_vertexSource));
	const glu::ShaderProgram	frgProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::FragmentSource(s_fragmentSource));
	const glu::ProgramPipeline	pipeline	(m_context.getRenderContext());
	glu::CallLogWrapper			gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result		(m_testCtx.getLog(), " // ERROR: ");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "VtxProg", "Vertex program");
		m_testCtx.getLog() << vtxProgram;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "FrgProg", "Fragment program");
		m_testCtx.getLog() << frgProgram;
	}

	if (!vtxProgram.isOk() || !frgProgram.isOk())
		throw tcu::TestError("failed to build program");

	gl.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	gl.glBindProgramPipeline(pipeline.getPipeline());
	gl.glUseProgramStages(pipeline.getPipeline(), GL_VERTEX_SHADER_BIT, vtxProgram.getProgram());
	gl.glUseProgramStages(pipeline.getPipeline(), GL_FRAGMENT_SHADER_BIT, frgProgram.getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");
	gl.glBindProgramPipeline(0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "unbind pipeline");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), GL_ACTIVE_PROGRAM, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Set", "Set");

		gl.glActiveShaderProgram(pipeline.getPipeline(), frgProgram.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");
		verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), GL_ACTIVE_PROGRAM, (int)frgProgram.getProgram(), m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}